

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

bool DecodeHexBlk(CBlock *block,string *strHexBlk)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view hex_str;
  Span<const_std::byte> sp;
  string_view str;
  DataStream ssBlock;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blockData;
  DataStream local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  TransactionSerParams *local_28;
  DataStream *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (strHexBlk->_M_dataplus)._M_p;
  str._M_len = strHexBlk->_M_string_length;
  bVar1 = IsHex(str);
  if (bVar1) {
    hex_str._M_str = (strHexBlk->_M_dataplus)._M_p;
    hex_str._M_len = strHexBlk->_M_string_length;
    ParseHex<unsigned_char>(&local_40,hex_str);
    sp.m_size = (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    DataStream::DataStream(&local_60,sp);
    local_28 = &TX_WITH_WITNESS;
    local_20 = &local_60;
    CBlock::
    SerializationOps<ParamsStream<DataStream&,TransactionSerParams>,CBlock,ActionUnserialize>(block)
    ;
    bVar1 = true;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_60);
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeHexBlk(CBlock& block, const std::string& strHexBlk)
{
    if (!IsHex(strHexBlk))
        return false;

    std::vector<unsigned char> blockData(ParseHex(strHexBlk));
    DataStream ssBlock(blockData);
    try {
        ssBlock >> TX_WITH_WITNESS(block);
    }
    catch (const std::exception&) {
        return false;
    }

    return true;
}